

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O0

bool __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
applyBestOperationAndUpdate
          (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this)

{
  EdgeOperation move_00;
  bool bVar1;
  const_reference pvVar2;
  value_type_conflict *pvVar3;
  reference ppVar4;
  reference puVar5;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  pair<const_unsigned_long,_double> w_1;
  iterator __end0_2;
  iterator __begin0_2;
  value_type *__range5_1;
  unsigned_long v_1;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_1;
  pair<const_unsigned_long,_double> w;
  iterator __end0_1;
  iterator __begin0_1;
  value_type *__range5;
  unsigned_long v;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<unsigned_long> *__range4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbours;
  value_type move;
  size_t in_stack_fffffffffffffe98;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *this_00;
  size_t in_stack_fffffffffffffea0;
  initializer_list<unsigned_long> *this_01;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffea8;
  priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
  *in_stack_fffffffffffffeb0;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this_02;
  value_type_conflict *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  value_type_conflict2 in_stack_fffffffffffffed8;
  _Self local_120;
  _Self local_118;
  reference local_110;
  size_type local_108;
  unsigned_long *local_100;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f8;
  undefined1 *local_f0;
  unsigned_long local_d8;
  double dStack_d0;
  _Self local_c0;
  _Self local_b8;
  reference local_b0;
  size_type local_a8;
  size_type *local_a0;
  size_type *local_98;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *local_90;
  initializer_list<unsigned_long> *local_88;
  initializer_list<unsigned_long> local_80;
  initializer_list<unsigned_long> *local_70;
  undefined1 local_68 [24];
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *local_50;
  initializer_list<unsigned_long> *local_48;
  value_type_conflict *local_40;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *local_38;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  *local_30;
  initializer_list<unsigned_long> *local_28;
  value_type_conflict *local_20;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *local_18;
  byte local_1;
  
  while( true ) {
    bVar1 = std::
            priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
            ::empty((priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                     *)0x1b41bd);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 0;
      goto LAB_001b45b2;
    }
    pvVar2 = std::
             priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
             ::top((priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                    *)0x1b41d9);
    local_30 = (map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                *)pvVar2->v0;
    local_28 = (initializer_list<unsigned_long> *)pvVar2->v1;
    local_20 = (value_type_conflict *)pvVar2->edition;
    local_18 = (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)pvVar2->delta;
    std::
    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
    ::pop(in_stack_fffffffffffffeb0);
    if (0.0 <= (double)local_18) break;
    bVar1 = DynamicLineage<std::vector<double,_std::allocator<double>_>_>::edgeExists
                      (in_RDI,(size_t)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    if ((bVar1) &&
       (in_stack_fffffffffffffeb8 = local_20,
       pvVar3 = (value_type_conflict *)
                getEdition(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe98), in_stack_fffffffffffffeb8 == pvVar3)) {
      local_50 = local_30;
      local_48 = local_28;
      local_40 = local_20;
      local_38 = local_18;
      move_00.v1 = in_stack_fffffffffffffec8;
      move_00.v0 = (size_t)in_RDI;
      move_00.edition = in_stack_fffffffffffffed0;
      move_00.delta = in_stack_fffffffffffffed8;
      this_00 = local_30;
      this_01 = local_28;
      pvVar3 = local_20;
      this_02 = local_18;
      DynamicLineage<std::vector<double,_std::allocator<double>_>_>::applyMove(local_18,move_00);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1b4321);
      local_90 = local_30;
      local_88 = local_28;
      local_80._M_array = (iterator)&local_90;
      local_80._M_len = 2;
      local_70 = &local_80;
      local_98 = std::initializer_list<unsigned_long>::begin(local_70);
      local_a0 = std::initializer_list<unsigned_long>::end(this_01);
      for (; local_98 != local_a0; local_98 = local_98 + 1) {
        local_a8 = *local_98;
        local_b0 = std::
                   vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                   ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                                 *)&(in_RDI->vertices_).
                                    super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,local_a8);
        local_b8._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::begin(this_00);
        local_c0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::end(this_00);
        while (bVar1 = std::operator!=(&local_b8,&local_c0), bVar1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator*
                             ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)0x1b4434
                             );
          local_d8 = ppVar4->first;
          dStack_d0 = ppVar4->second;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,pvVar3);
          std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)this_01);
        }
      }
      local_f0 = local_68;
      local_f8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      local_100 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)this_01,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)this_00), bVar1) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_f8);
        local_108 = *puVar5;
        local_110 = std::
                    vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                    ::operator[]((vector<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                                  *)&(in_RDI->vertices_).
                                     super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,local_108);
        local_118._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::begin(this_00);
        local_120._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::end(this_00);
        while (bVar1 = std::operator!=(&local_118,&local_120), bVar1) {
          ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator*
                             ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)0x1b4556
                             );
          proposeMove((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
                      ppVar4->second,ppVar4->first,(size_t)in_RDI);
          std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>::operator++
                    ((_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_> *)this_01);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_f8);
      }
      local_1 = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02);
LAB_001b45b2:
      return (bool)(local_1 & 1);
    }
  }
  local_1 = 0;
  goto LAB_001b45b2;
}

Assistant:

inline bool virtual applyBestOperationAndUpdate()
    {
        while (!queue_.empty()) {

            const auto move = queue_.top();
            queue_.pop();

            if (move.delta >= 0) {
                return false;
            } else if (!this->edgeExists(move.v0, move.v1)) {
                continue;
            } else if (move.edition != getEdition(move.v0, move.v1)) {
                continue;
            }

            this->applyMove(move);

            std::vector<size_t> neighbours;
            for (auto v : { move.v0, move.v1 }) {
                for (auto w : this->vertices_[v]) {
                    neighbours.push_back(w.first);
                }
            }

            for (auto v : neighbours) {
                for (auto w : this->vertices_[v]) {
                    proposeMove(v, w.first);
                }
            }
            return true;
        }
        return false;
    }